

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psquare_suite.cpp
# Opt level: O1

void double_approx_suite::test_count_100(void)

{
  undefined8 uVar1;
  long lVar2;
  ostream *poVar3;
  pointer ppVar4;
  pointer ppVar5;
  long lVar6;
  double dVar7;
  initializer_list<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>
  __l;
  close_to<double> predicate;
  double *in_stack_fffffffffffffe98;
  ulong uVar8;
  vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  params;
  vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  expected;
  parameter_type local_128;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  psquare_median<double> quantile;
  
  quantile.count = 0;
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::initialize(&quantile);
  local_128.position = 0x14;
  local_128.height = -2.0;
  local_118 = 0x28;
  local_110 = 0x3fe0000000000000;
  local_108 = 0x3c;
  local_100 = (undefined1 *)0x3ff0000000000000;
  local_f8 = 0x50;
  local_f0 = 0x3ff8000000000000;
  local_e8 = 100;
  local_e0 = 0x4010000000000000;
  __l._M_len = 5;
  __l._M_array = &local_128;
  std::
  vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  ::vector(&expected,__l,(allocator_type *)&params);
  lVar2 = 0;
  do {
    uVar1 = *(undefined8 *)
             ((long)&(expected.
                      super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                      ._M_impl.super__Vector_impl_data._M_start)->position + lVar2 * 2);
    dVar7 = ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    *(double *)((long)quantile.desired_positions._M_elems + lVar2) = dVar7;
    *(long *)((long)quantile.positions._M_elems + lVar2) =
         (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
    *(undefined8 *)((long)quantile.heights._M_elems + lVar2) =
         *(undefined8 *)
          ((long)&(expected.
                   super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                   ._M_impl.super__Vector_impl_data._M_start)->height + lVar2 * 2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x28);
  quantile.count = 5;
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::push(&quantile,1000.0);
  local_128.position =
       (size_type)
       trial::online::quantile::psquare<double,std::ratio<1l,2l>>::get<1ul>
                 ((psquare<double,std::ratio<1l,2l>> *)&quantile);
  params.
  super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_3ff061693c03bc4d;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value()","1.023782","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x36f,0x114725,(char *)&local_128,(double *)&params,in_stack_fffffffffffffe98,
             predicate);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameters(&params,&quantile);
  local_128.position = 0x14;
  local_128.height = -2.0;
  local_118 = 0x29;
  local_110 = 0x3fe251eb851eb852;
  local_108 = 0x3d;
  local_100 = &DAT_3ff061693c03bc4d;
  local_f8 = 0x51;
  local_f0 = 0x4039494d94078961;
  local_e8 = 0x65;
  local_e0 = 0x408f400000000000;
  std::
  vector<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type,std::allocator<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type>>
  ::_M_assign_aux<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type_const*>
            ((vector<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type,std::allocator<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type>>
              *)&expected,&local_128);
  uVar8 = 0;
  lVar6 = 0;
  lVar2 = 0;
  ppVar4 = expected.
           super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = params.
           super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    while ((((ppVar5 != params.
                        super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                        ._M_impl.super__Vector_impl_data._M_finish &&
             (ppVar4 != expected.
                        super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                        ._M_impl.super__Vector_impl_data._M_finish)) &&
            (ppVar5->position == ppVar4->position)) &&
           (ABS(ppVar5->height - ppVar4->height) <= 1e-05))) {
      lVar2 = lVar2 + 1;
      lVar6 = lVar6 + 1;
      ppVar4 = ppVar4 + 1;
      ppVar5 = ppVar5 + 1;
    }
    if ((ppVar5 == params.
                   super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                   ._M_impl.super__Vector_impl_data._M_finish) ||
       (ppVar4 == expected.
                  super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                  ._M_impl.super__Vector_impl_data._M_finish)) break;
    if (uVar8 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
                 ,0x67);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x372);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"): Container contents differ in function \'",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"void double_approx_suite::test_count_100()",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\':",2);
    }
    else if (7 < uVar8) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ...",4);
      break;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," [",2);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    ppVar5 = ppVar5 + 1;
    ppVar4 = ppVar4 + 1;
    lVar2 = lVar2 + 1;
    lVar6 = lVar6 + 1;
    uVar8 = uVar8 + 1;
  } while (ppVar5 != params.
                     super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (((long)params.
             super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 4) + lVar2 !=
      ((long)expected.
             super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 4) + lVar6) {
    if (uVar8 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
                 ,0x67);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x372);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"): Container sizes differ in function \'",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"void double_approx_suite::test_count_100()",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\': size(",8);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") != size(",10);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," [*] size(",10);
      poVar3 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") != size(",10);
    }
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    uVar8 = uVar8 + 1;
  }
  if (uVar8 == 0) {
    if (boost::detail::test_results()::instance == '\0') {
      test_count_100();
    }
  }
  else {
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    if (boost::detail::test_results()::instance == '\0') {
      test_count_100();
    }
    boost::detail::test_results()::instance._4_4_ =
         boost::detail::test_results()::instance._4_4_ + 1;
  }
  if (params.
      super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(params.
                    super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)params.
                          super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)params.
                          super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (expected.
      super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(expected.
                    super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)expected.
                          super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)expected.
                          super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_count_100()
{
    quantile::psquare_median<double> quantile;
    const double tolerance_threshold = 1e-5;
    const auto tolerance = detail::close_to<double>(tolerance_threshold);
    auto parameter_tolerance =
        [tolerance_threshold]
        (const decltype(quantile)::parameter_type& lhs, const decltype(quantile)::parameter_type& rhs)
        {
            return ((lhs.position == rhs.position) &&
                    std::fabs(lhs.height - rhs.height) <= tolerance_threshold);
        };

    // Approximate normal distribution with expectation 1 and spread 1 after 100 iterations.
    decltype(quantile.parameters()) expected = {
        { 20, -2.0 },
        { 40, 0.5 },
        { 60, 1.0 },
        { 80, 1.5 },
        { 100, 4.0 } };
    quantile.parameters(expected);

    quantile.push(1000.0);
    TRIAL_TEST_WITH(quantile.value(), 1.023782, tolerance);
    auto params = quantile.parameters();
    expected = { {20, -2.0}, {41, 0.5725}, {61, 1.023782}, {81, 25.28634}, {101, 1000.0} };
    TRIAL_TEST_ALL_WITH(params.begin(), params.end(), expected.begin(), expected.end(), parameter_tolerance);
}